

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

ImFont * __thiscall
ImFontAtlas::AddFontFromMemoryCompressedTTF
          (ImFontAtlas *this,void *compressed_ttf_data,int compressed_ttf_size,float size_pixels,
          ImFontConfig *font_cfg_template,ImWchar *glyph_ranges)

{
  uint font_data_size;
  ImFontConfig *font_cfg_template_00;
  ImFont *pIVar1;
  ImFontAtlas *in_RCX;
  uchar *in_RSI;
  ImFontConfig *in_RDI;
  void *in_R8;
  ImFontConfig font_cfg;
  uchar *buf_decompressed_data;
  uint buf_decompressed_size;
  uint in_stack_ffffffffffffff2c;
  uchar *in_stack_ffffffffffffff38;
  ImWchar *in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffd0;
  
  font_data_size = stb_decompress_length(in_RSI);
  font_cfg_template_00 = (ImFontConfig *)ImGui::MemAlloc((size_t)in_RDI);
  stb_decompress(in_stack_ffffffffffffff38,(uchar *)in_RDI,in_stack_ffffffffffffff2c);
  if (in_RCX == (ImFontAtlas *)0x0) {
    ImFontConfig::ImFontConfig(in_RDI);
  }
  else {
    memcpy(&stack0xffffffffffffff38,in_RCX,0x90);
  }
  pIVar1 = AddFontFromMemoryTTF
                     (in_RCX,in_R8,font_data_size,in_stack_ffffffffffffffd0,font_cfg_template_00,
                      in_stack_ffffffffffffffc0);
  return pIVar1;
}

Assistant:

ImFont* ImFontAtlas::AddFontFromMemoryCompressedTTF(const void* compressed_ttf_data, int compressed_ttf_size, float size_pixels, const ImFontConfig* font_cfg_template, const ImWchar* glyph_ranges)
{
    const unsigned int buf_decompressed_size = stb_decompress_length((const unsigned char*)compressed_ttf_data);
    unsigned char* buf_decompressed_data = (unsigned char*)IM_ALLOC(buf_decompressed_size);
    stb_decompress(buf_decompressed_data, (const unsigned char*)compressed_ttf_data, (unsigned int)compressed_ttf_size);

    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    IM_ASSERT(font_cfg.FontData == NULL);
    font_cfg.FontDataOwnedByAtlas = true;
    return AddFontFromMemoryTTF(buf_decompressed_data, (int)buf_decompressed_size, size_pixels, &font_cfg, glyph_ranges);
}